

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O1

void __thiscall BinHash<TldAddressAsKey>::Clear(BinHash<TldAddressAsKey> *this)

{
  TldAddressAsKey **ppTVar1;
  TldAddressAsKey *pTVar2;
  ulong uVar3;
  
  if (this->hashBin != (TldAddressAsKey **)0x0) {
    if (this->tableSize != 0) {
      uVar3 = 0;
      do {
        pTVar2 = this->hashBin[uVar3];
        if (pTVar2 != (TldAddressAsKey *)0x0) {
          ppTVar1 = this->hashBin + uVar3;
          do {
            *ppTVar1 = pTVar2->HashNext;
            operator_delete(pTVar2);
            ppTVar1 = this->hashBin + uVar3;
            pTVar2 = *ppTVar1;
          } while (pTVar2 != (TldAddressAsKey *)0x0);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->tableSize);
    }
    if (this->hashBin != (TldAddressAsKey **)0x0) {
      operator_delete__(this->hashBin);
    }
    this->hashBin = (TldAddressAsKey **)0x0;
  }
  this->tableSize = 0;
  this->tableCount = 0;
  return;
}

Assistant:

void Clear()
    {
        if (hashBin != NULL)
        {
            for (uint32_t i = 0; i < tableSize; i++)
            {
                while (hashBin[i] != NULL)
                {
                    KeyObj *x = hashBin[i];
                    hashBin[i] = x->HashNext;
                    delete x;
                }
            }

            delete[] hashBin;
            hashBin = NULL;
        }

        tableCount = 0;
        tableSize = 0;
    }